

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O0

void __thiscall
unodb::in_critical_section<unsigned_char>::store
          (in_critical_section<unsigned_char> *this,uchar new_value)

{
  uchar new_value_local;
  in_critical_section<unsigned_char> *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->value).super___atomic_base<unsigned_char>._M_i = new_value;
  return;
}

Assistant:

void store(T new_value) noexcept {
    value.store(new_value, std::memory_order_relaxed);
  }